

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic-base.hxx
# Opt level: O3

Solution * __thiscall
lineage::heuristics::
applyHeuristic<lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
          (Solution *__return_storage_ptr__,heuristics *this,ProblemGraph *problemGraph,
          double costTermination,double costBirth,bool enforceBifurcationConstraint,
          string *solutionName,size_t maxIter)

{
  long *plVar1;
  long lVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  Data data;
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> search;
  double local_2b8;
  double local_2b0;
  undefined1 local_2a8 [32];
  pointer local_288;
  iterator iStack_280;
  double *local_278;
  bool local_270;
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  double local_248;
  time_point tStack_240;
  undefined1 local_238 [8];
  DynamicLineage<std::vector<double,_std::allocator<double>_>_> DStack_230;
  pointer local_188;
  pointer local_178;
  vector<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  local_168;
  ios_base local_140 [272];
  
  lVar2 = *(long *)CONCAT71(in_register_00000009,enforceBifurcationConstraint);
  local_2b8 = costBirth;
  local_2b0 = costTermination;
  local_2a8._0_8_ = (ProblemGraph *)(local_2a8 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a8,lVar2,
             ((long *)CONCAT71(in_register_00000009,enforceBifurcationConstraint))[1] + lVar2);
  std::__cxx11::string::append((char *)local_2a8);
  std::ofstream::ofstream(local_238,(string *)local_2a8,_S_out);
  if ((ProblemGraph *)local_2a8._0_8_ != (ProblemGraph *)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,
             "time objBound objBest gap nSpaceCycle nSpaceTime nMorality nTermination nBirth nBifurcation objValue time_separation\n"
             ,0x75);
  std::ofstream::close();
  local_238 = (undefined1  [8])_VTT;
  *(undefined8 *)(_VTT[-3] + (long)local_238) = _memcpy;
  std::filebuf::~filebuf((filebuf *)(local_238 + 8));
  std::ios_base::~ios_base(local_140);
  local_288 = (pointer)0x0;
  iStack_280._M_current = (double *)0x0;
  local_278 = (double *)0x0;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_248 = 0.0;
  tStack_240.__d.__r = (duration)0;
  local_2a8._0_8_ = this;
  local_2a8._8_8_ = costTermination;
  local_2a8._16_8_ = costBirth;
  local_270 = (bool)(char)problemGraph;
  local_268._M_p = (pointer)&local_258;
  std::__cxx11::string::_M_assign((string *)&local_268);
  plVar3 = *(long **)(*(long *)this + 0x18);
  plVar1 = *(long **)(*(long *)this + 0x20);
  if (plVar3 != plVar1) {
    do {
      DStack_230.vertices_.
      super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar3[2];
      local_238 = (undefined1  [8])*plVar3;
      DStack_230.data_ = (Data *)plVar3[1];
      if (iStack_280._M_current == local_278) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_288,iStack_280,
                   (double *)(local_238 + 0x10));
      }
      else {
        *iStack_280._M_current =
             (double)DStack_230.vertices_.
                     super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        iStack_280._M_current = iStack_280._M_current + 1;
      }
      plVar3 = plVar3 + 3;
    } while (plVar3 != plVar1);
  }
  if (0.0 < costTermination) {
    std::vector<double,_std::allocator<double>_>::_M_fill_insert
              ((vector<double,_std::allocator<double>_> *)&local_288,iStack_280,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&local_2b0);
  }
  if (0.0 < costBirth) {
    std::vector<double,_std::allocator<double>_>::_M_fill_insert
              ((vector<double,_std::allocator<double>_> *)&local_288,iStack_280,
               *(long *)(this + 0x10) - *(long *)(this + 8) >> 5,&local_2b8);
  }
  tStack_240.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
  GreedyLineageAgglomeration
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_238,
             (Data *)local_2a8);
  GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::optimize
            ((GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_238)
  ;
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::getSolution
            (__return_storage_ptr__,
             (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(local_238 + 8));
  lVar2 = std::chrono::_V2::system_clock::now();
  local_248 = (double)(lVar2 - (long)tStack_240.__d.__r) / 1000000000.0 + local_248;
  postOptimizationChecks<lineage::Data,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>,lineage::Solution>
            ((Data *)local_2a8,
             (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *)local_238,
             __return_storage_ptr__);
  local_238 = (undefined1  [8])&PTR_applyBestOperationAndUpdate_0012cd38;
  std::
  vector<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
  ::~vector((vector<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::allocator<std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
             *)(local_238 + 0xd0));
  if (local_188 != (pointer)0x0) {
    operator_delete(local_188,(long)local_178 - (long)local_188);
  }
  DynamicLineage<std::vector<double,_std::allocator<double>_>_>::~DynamicLineage
            ((DynamicLineage<std::vector<double,_std::allocator<double>_>_> *)(local_238 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_p != &local_258) {
    operator_delete(local_268._M_p,
                    CONCAT71(local_258._M_allocated_capacity._1_7_,local_258._M_local_buf[0]) + 1);
  }
  if (local_288 != (pointer)0x0) {
    operator_delete(local_288,(long)local_278 - (long)local_288);
  }
  return __return_storage_ptr__;
}

Assistant:

Solution
applyHeuristic(ProblemGraph const& problemGraph, double costTermination = .0,
               double costBirth = .0, bool enforceBifurcationConstraint = false,
               std::string solutionName = "heuristic", size_t maxIter = 500)
{

    // create log file/replace existing log file with empty log file
    {
        std::ofstream file(solutionName + "-optimization-log.txt");
        file << "time objBound objBest gap nSpaceCycle nSpaceTime nMorality "
                "nTermination nBirth nBifurcation objValue time_separation\n";
        file.close();
    }

    Data data(problemGraph);
    data.costBirth = costBirth;
    data.costTermination = costTermination;
    data.enforceBifurcationConstraint = enforceBifurcationConstraint;
    data.solutionName = solutionName;

    // define costs
    for (auto e : problemGraph.problem().edges)
        data.costs.push_back(e.weight);

    if (costTermination > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(),
                          costTermination);

    if (costBirth > 0.0)
        data.costs.insert(data.costs.end(),
                          problemGraph.graph().numberOfVertices(), costBirth);

    data.timer.start();
    auto search = OPTIMIZER(data);
    search.setMaxIter(maxIter);

    search.optimize();
    const auto solution = search.getSolution();
    data.timer.stop();

    postOptimizationChecks(data, search, solution);

    return solution;
}